

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

int64_t yactfr::internal::anon_unknown_0::readFlSIntBe3At4(uint8_t *buf)

{
  ulong uVar1;
  uint uVar2;
  
  uVar2 = *buf >> 1 & 7;
  uVar1 = (ulong)uVar2 - 8;
  if ((byte)uVar2 < 4) {
    uVar1 = (ulong)uVar2;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntBe3At4(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= (buf[0] >> 1);
    res &= UINT64_C(0x7);

    if (res >> 2) {
        res |= UINT64_C(0xfffffffffffffff8);
    }

    return static_cast<std::int64_t>(res);
}